

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

void __thiscall
cmParseJacocoCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  cmCTest *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  size_type sVar9;
  reference __lhs;
  mapped_type *this_00;
  reference pvVar10;
  FileLinesType *curFileLines_1;
  int local_6f0;
  int ci;
  int nr;
  int tagCount;
  vector<int,_std::allocator<int>_> *local_6e0;
  FileLinesType *curFileLines;
  string line;
  undefined1 local_698 [8];
  ostringstream cmCTestLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  long local_4e0;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  string finalpath;
  size_t i;
  ostringstream local_268 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string FilePath;
  char **atts_local;
  string *name_local;
  XMLParser *this_local;
  
  FilePath.field_2._8_8_ = atts;
  bVar3 = std::operator==(name,"package");
  if (bVar3) {
    std::__cxx11::string::operator=
              ((string *)&this->PackageName,*(char **)(FilePath.field_2._8_8_ + 8));
    std::operator+(&local_a0,&this->Coverage->SourceDir,"/");
    std::operator+(&local_80,&local_a0,&this->ModuleName);
    std::operator+(&local_60,&local_80,"/src/main/java/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,&this->PackageName);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->FilePaths,(value_type *)local_40);
    std::operator+(&local_f0,&this->Coverage->SourceDir,"/src/main/java/");
    std::operator+(&local_d0,&local_f0,&this->PackageName);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->FilePaths,(value_type *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    bVar3 = std::operator==(name,"sourcefile");
    if (bVar3) {
      std::__cxx11::string::operator=
                ((string *)&this->FileName,*(char **)(FilePath.field_2._8_8_ + 8));
      std::__cxx11::ostringstream::ostringstream(local_268);
      poVar7 = std::operator<<((ostream *)local_268,"Reading file: ");
      poVar7 = std::operator<<(poVar7,(string *)&this->FileName);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                   ,0x36,pcVar8,(bool)(this->Coverage->Quiet & 1));
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::ostringstream::~ostringstream(local_268);
      for (finalpath.field_2._8_8_ = 0; uVar2 = finalpath.field_2._8_8_,
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->FilePaths), (ulong)uVar2 < sVar9;
          finalpath.field_2._8_8_ = finalpath.field_2._8_8_ + 1) {
        __lhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->FilePaths,finalpath.field_2._8_8_);
        std::operator+(&local_2d0,__lhs,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0,&local_2d0,&this->FileName);
        std::__cxx11::string::~string((string *)&local_2d0);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        bVar3 = cmsys::SystemTools::FileExists(pcVar8);
        if (bVar3) {
          std::__cxx11::string::operator=((string *)&this->CurFileName,(string *)local_2b0);
        }
        std::__cxx11::string::~string((string *)local_2b0);
        if (bVar3) break;
      }
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_4e0,pcVar8,_S_in);
      bVar3 = std::operator==(&this->CurFileName,"");
      if ((bVar3) ||
         (bVar4 = std::ios::operator!((ios *)((long)&local_4e0 + *(long *)(local_4e0 + -0x18))),
         (bVar4 & 1) != 0)) {
        std::operator+(&local_520,&this->Coverage->BinaryDir,"/");
        std::operator+(&local_500,&local_520,&this->FileName);
        std::__cxx11::string::operator=((string *)&this->CurFileName,(string *)&local_500);
        std::__cxx11::string::~string((string *)&local_500);
        std::__cxx11::string::~string((string *)&local_520);
        _Var5 = std::__cxx11::string::c_str();
        std::ifstream::open((char *)&local_4e0,_Var5);
        bVar4 = std::ios::operator!((ios *)((long)&local_4e0 + *(long *)(local_4e0 + -0x18)));
        if ((bVar4 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
          poVar7 = std::operator<<((ostream *)local_698,"Jacoco Coverage: Error opening ");
          poVar7 = std::operator<<(poVar7,(string *)&this->CurFileName);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                       ,0x4a,pcVar8,false);
          std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
          this->Coverage->Error = this->Coverage->Error + 1;
        }
      }
      std::__cxx11::string::string((string *)&curFileLines);
      local_6e0 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
      bVar3 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_4e0 + *(long *)(local_4e0 + -0x18)));
      if (bVar3) {
        tagCount = -1;
        std::vector<int,_std::allocator<int>_>::push_back(local_6e0,&tagCount);
      }
      while (bVar3 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&local_4e0,(string *)&curFileLines,(bool *)0x0,-1), bVar3
            ) {
        nr = -1;
        std::vector<int,_std::allocator<int>_>::push_back(local_6e0,&nr);
      }
      std::__cxx11::string::~string((string *)&curFileLines);
      std::ifstream::~ifstream(&local_4e0);
    }
    else {
      bVar3 = std::operator==(name,"report");
      if (bVar3) {
        std::__cxx11::string::operator=
                  ((string *)&this->ModuleName,*(char **)(FilePath.field_2._8_8_ + 8));
      }
      else {
        bVar3 = std::operator==(name,"line");
        if (bVar3) {
          ci = 0;
          local_6f0 = -1;
          curFileLines_1._4_4_ = -1;
          while( true ) {
            iVar6 = strcmp(*(char **)(FilePath.field_2._8_8_ + (long)ci * 8),"ci");
            if (iVar6 == 0) {
              curFileLines_1._4_4_ = atoi(*(char **)(FilePath.field_2._8_8_ + (long)(ci + 1) * 8));
            }
            else {
              iVar6 = strcmp(*(char **)(FilePath.field_2._8_8_ + (long)ci * 8),"nr");
              if (iVar6 == 0) {
                local_6f0 = atoi(*(char **)(FilePath.field_2._8_8_ + (long)(ci + 1) * 8));
              }
            }
            if ((-1 < curFileLines_1._4_4_) && (0 < local_6f0)) break;
            ci = ci + 1;
          }
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
          bVar3 = std::vector<int,_std::allocator<int>_>::empty(this_00);
          if (!bVar3) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (this_00,(long)(local_6f0 + -1));
            *pvVar10 = curFileLines_1._4_4_;
          }
        }
      }
    }
  }
  return;
}

Assistant:

virtual void StartElement(const std::string& name,
      const char** atts)
      {
      if(name == "package")
        {
        this->PackageName = atts[1];
        std::string FilePath = this->Coverage.SourceDir +
          "/" + this->ModuleName + "/src/main/java/" +
          this->PackageName;
        this->FilePaths.push_back(FilePath);
        FilePath = this->Coverage.SourceDir +
         "/src/main/java/" + this->PackageName;
        this->FilePaths.push_back(FilePath);
        }
      else if(name == "sourcefile")
        {
        this->FileName = atts[1];
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
          "Reading file: " << this->FileName << std::endl,
          this->Coverage.Quiet);
          for(size_t i=0;i < FilePaths.size();i++)
            {
            std::string finalpath = FilePaths[i] + "/" + this->FileName;
            if(cmSystemTools::FileExists(finalpath.c_str()))
              {
              this->CurFileName = finalpath;
              break;
              }
            }
          cmsys::ifstream fin(this->CurFileName.c_str());
          if(this->CurFileName == "" || !fin )
          {
            this->CurFileName = this->Coverage.BinaryDir + "/" +
                                   this->FileName;
            fin.open(this->CurFileName.c_str());
            if (!fin)
            {
              cmCTestLog(this->CTest, ERROR_MESSAGE,
                         "Jacoco Coverage: Error opening " << this->CurFileName
                         << std::endl);
              this->Coverage.Error++;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          if(fin)
            {
            curFileLines.push_back(-1);
            }
          while(cmSystemTools::GetLineFromStream(fin, line))
          {
            curFileLines.push_back(-1);
          }
        }
      else if(name == "report")
        {
        this->ModuleName=atts[1];
        }
      else if(name == "line")
        {
        int tagCount = 0;
        int nr = -1;
        int ci = -1;
        while(true)
          {
          if(strcmp(atts[tagCount],"ci") == 0)
            {
            ci = atoi(atts[tagCount+1]);
            }
          else if (strcmp(atts[tagCount],"nr") == 0)
            {
            nr = atoi(atts[tagCount+1]);
            }
          if (ci > -1 && nr > 0)
            {
            FileLinesType& curFileLines=
              this->Coverage.TotalCoverage[this->CurFileName];
            if(!curFileLines.empty())
               {
               curFileLines[nr-1] = ci;
               }
            break;
            }
          ++tagCount;
          }
        }
      }